

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintTents_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vObjs_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vObjs,iVar1);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManPrintTents_rec(p,pGVar2,vObjs);
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 != 0) {
        pGVar2 = Gia_ObjFanin1(pObj);
        Gia_ManPrintTents_rec(p,pGVar2,vObjs);
      }
    }
  }
  return;
}

Assistant:

void Gia_ManPrintTents_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    Vec_IntPush( vObjs, Gia_ObjId(p, pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return;
    Gia_ManPrintTents_rec( p, Gia_ObjFanin0(pObj), vObjs );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintTents_rec( p, Gia_ObjFanin1(pObj), vObjs );
}